

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

void __thiscall kratos::StatementGraph::StatementGraph(StatementGraph *this,Generator *generator)

{
  Generator *generator_local;
  StatementGraph *this_local;
  
  std::
  unordered_map<kratos::Stmt_*,_kratos::StmtNode,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_kratos::StmtNode>_>_>
  ::unordered_map(&this->nodes_);
  this->root_ = generator;
  build_graph(this);
  return;
}

Assistant:

StatementGraph::StatementGraph(Generator *generator) : root_(generator) {
    // build the control flow graph
    build_graph();
}